

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpdtrans.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::CompoundTransliterator::joinIDs
          (UnicodeString *__return_storage_ptr__,CompoundTransliterator *this,
          Transliterator **transliterators,int32_t transCount)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  uVar2 = 0;
  uVar3 = (ulong)(uint)transCount;
  if (transCount < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      icu_63::UnicodeString::append(__return_storage_ptr__,L';');
    }
    iVar1 = (*(transliterators[uVar2]->super_UObject)._vptr_UObject[0xd])();
    icu_63::UnicodeString::append
              (__return_storage_ptr__,(UnicodeString *)CONCAT44(extraout_var,iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CompoundTransliterator::joinIDs(Transliterator* const transliterators[],
                                              int32_t transCount) {
    UnicodeString id;
    for (int32_t i=0; i<transCount; ++i) {
        if (i > 0) {
            id.append(ID_DELIM);
        }
        id.append(transliterators[i]->getID());
    }
    return id; // Return temporary
}